

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall
crnlib::symbol_codec::decode_set_input_buffer
          (symbol_codec *this,uint8 *pBuf,size_t buf_size,uint8 *pBuf_next,bool eof_flag)

{
  bool eof_flag_local;
  uint8 *pBuf_next_local;
  size_t buf_size_local;
  uint8 *pBuf_local;
  symbol_codec *this_local;
  
  this->m_pDecode_buf = pBuf;
  this->m_pDecode_buf_next = pBuf_next;
  this->m_decode_buf_size = buf_size;
  this->m_pDecode_buf_end = pBuf + buf_size;
  if (this->m_pDecode_need_bytes_func == (need_bytes_func_ptr)0x0) {
    this->m_decode_buf_eof = true;
  }
  else {
    this->m_decode_buf_eof = eof_flag;
  }
  return;
}

Assistant:

void symbol_codec::decode_set_input_buffer(const uint8* pBuf, size_t buf_size, const uint8* pBuf_next, bool eof_flag) {
  CRNLIB_ASSERT(m_mode == cDecoding);

  m_pDecode_buf = pBuf;
  m_pDecode_buf_next = pBuf_next;
  m_decode_buf_size = buf_size;
  m_pDecode_buf_end = pBuf + buf_size;

  if (!m_pDecode_need_bytes_func)
    m_decode_buf_eof = true;
  else
    m_decode_buf_eof = eof_flag;
}